

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void updateHashChain(Hash *hash,size_t wpos,uint hashval,unsigned_short numzeros)

{
  int iVar1;
  int *piVar2;
  
  hash->val[wpos] = hashval;
  piVar2 = hash->head;
  iVar1 = piVar2[hashval];
  if (iVar1 != -1) {
    hash->chain[wpos] = (unsigned_short)iVar1;
  }
  piVar2[hashval] = (int)wpos;
  hash->zeros[wpos] = numzeros;
  piVar2 = hash->headz;
  iVar1 = piVar2[numzeros];
  if (iVar1 != -1) {
    hash->chainz[wpos] = (unsigned_short)iVar1;
  }
  piVar2[numzeros] = (int)wpos;
  return;
}

Assistant:

static void updateHashChain(Hash* hash, size_t wpos, unsigned hashval, unsigned short numzeros) {
  hash->val[wpos] = (int)hashval;
  if(hash->head[hashval] != -1) hash->chain[wpos] = hash->head[hashval];
  hash->head[hashval] = (int)wpos;

  hash->zeros[wpos] = numzeros;
  if(hash->headz[numzeros] != -1) hash->chainz[wpos] = hash->headz[numzeros];
  hash->headz[numzeros] = (int)wpos;
}